

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool useSpecialFloats;
  bool bVar3;
  UInt UVar4;
  uint precision;
  Value *pVVar5;
  BuiltStyledStreamWriter *this_00;
  Enum cs;
  Value *this_01;
  string nullSymbol;
  string colonSymbol;
  string endingLineFeedSymbol;
  string cs_str;
  string indentation;
  
  this_01 = &this->settings_;
  pVVar5 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&indentation,pVVar5);
  pVVar5 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&cs_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"useSpecialFloats");
  useSpecialFloats = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"precision");
  UVar4 = Value::asUInt(pVVar5);
  bVar3 = std::operator==(&cs_str,"All");
  if (bVar3) {
    cs = All;
  }
  else {
    bVar3 = std::operator==(&cs_str,"None");
    cs = None;
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'",
                 (allocator<char> *)&nullSymbol);
      throwRuntimeError(&colonSymbol);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colonSymbol," : ",(allocator<char> *)&nullSymbol);
  if ((bVar1) || (indentation._M_string_length == 0)) {
    std::__cxx11::string::assign((char *)&colonSymbol);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nullSymbol,"null",(allocator<char> *)&endingLineFeedSymbol);
  if (bVar2) {
    nullSymbol._M_string_length = 0;
    *nullSymbol._M_dataplus._M_p = '\0';
  }
  endingLineFeedSymbol._M_dataplus._M_p = (pointer)&endingLineFeedSymbol.field_2;
  endingLineFeedSymbol._M_string_length = 0;
  endingLineFeedSymbol.field_2._M_local_buf[0] = '\0';
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  precision = 0x11;
  if (UVar4 < 0x11) {
    precision = UVar4;
  }
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&indentation,cs,&colonSymbol,&nullSymbol,&endingLineFeedSymbol,useSpecialFloats
             ,precision);
  std::__cxx11::string::~string((string *)&endingLineFeedSymbol);
  std::__cxx11::string::~string((string *)&nullSymbol);
  std::__cxx11::string::~string((string *)&colonSymbol);
  std::__cxx11::string::~string((string *)&cs_str);
  std::__cxx11::string::~string((string *)&indentation);
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  JSONCPP_STRING indentation = settings_["indentation"].asString();
  JSONCPP_STRING cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  bool usf = settings_["useSpecialFloats"].asBool(); 
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  JSONCPP_STRING colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  JSONCPP_STRING nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17) pre = 17;
  JSONCPP_STRING endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol, usf, pre);
}